

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  cJSON_bool cVar5;
  long lVar6;
  ulong uVar7;
  cJSON *pcVar8;
  cJSON *pcVar9;
  cJSON *item_00;
  cJSON *pcVar10;
  uint uVar11;
  uchar *puVar12;
  double dVar13;
  uchar *after_end;
  byte local_78 [72];
  
  if (input_buffer == (parse_buffer *)0x0) {
    return 0;
  }
  puVar12 = input_buffer->content;
  if (puVar12 == (uchar *)0x0) {
    return 0;
  }
  uVar2 = input_buffer->length;
  uVar3 = input_buffer->offset;
  uVar7 = uVar3 + 4;
  if ((uVar7 <= uVar2) && (iVar4 = strncmp((char *)(puVar12 + uVar3),"null",4), iVar4 == 0)) {
    item->type = 4;
    input_buffer->offset = uVar7;
    return 1;
  }
  if ((uVar3 + 5 <= uVar2) && (iVar4 = strncmp((char *)(puVar12 + uVar3),"false",5), iVar4 == 0)) {
    item->type = 1;
    input_buffer->offset = uVar3 + 5;
    return 1;
  }
  if ((uVar7 <= uVar2) && (iVar4 = strncmp((char *)(puVar12 + uVar3),"true",4), iVar4 == 0)) {
    item->type = 2;
    item->valueint = 1;
    input_buffer->offset = uVar7;
    return 1;
  }
  if (uVar2 <= uVar3) {
    return 0;
  }
  uVar1 = puVar12[uVar3];
  if (uVar1 == '\"') {
    cVar5 = parse_string(item,input_buffer);
    return cVar5;
  }
  puVar12 = puVar12 + uVar3;
  if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
    after_end = (uchar *)0x0;
    for (lVar6 = 0; (lVar6 != 0x3f && (uVar3 + lVar6 < uVar2)); lVar6 = lVar6 + 1) {
      uVar11 = puVar12[lVar6] - 0x2b;
      if ((0x3a < uVar11) || ((0x400000004007fedU >> ((ulong)uVar11 & 0x3f) & 1) == 0)) break;
      local_78[lVar6] = puVar12[lVar6];
    }
    local_78[lVar6] = 0;
    dVar13 = strtod((char *)local_78,(char **)&after_end);
    if (local_78 == after_end) {
      return 0;
    }
    item->valuedouble = dVar13;
    iVar4 = 0x7fffffff;
    if ((dVar13 < 2147483647.0) && (iVar4 = -0x80000000, -2147483648.0 < dVar13)) {
      iVar4 = (int)dVar13;
    }
    item->valueint = iVar4;
    item->type = 8;
    input_buffer->offset = (size_t)(after_end + (input_buffer->offset - (long)local_78));
    return 1;
  }
  if (uVar1 == '{') {
    if (999 < input_buffer->depth) {
      return 0;
    }
    input_buffer->depth = input_buffer->depth + 1;
    if (*puVar12 != '{') {
      return 0;
    }
    input_buffer->offset = uVar3 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar7 = input_buffer->offset;
    if (uVar7 < input_buffer->length) {
      if (input_buffer->content[uVar7] == '}') {
        item_00 = (cJSON *)0x0;
      }
      else {
        input_buffer->offset = uVar7 - 1;
        pcVar10 = (cJSON *)0x0;
        pcVar8 = (cJSON *)0x0;
        do {
          pcVar9 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          item_00 = pcVar10;
          if (pcVar9 == (cJSON *)0x0) goto joined_r0x0012b340;
          pcVar9->valuedouble = 0.0;
          pcVar9->string = (char *)0x0;
          pcVar9->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar9->valueint = 0;
          pcVar9->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar9->type = 0;
          pcVar9->next = (cJSON *)0x0;
          pcVar9->prev = (cJSON *)0x0;
          item_00 = pcVar9;
          if (pcVar10 != (cJSON *)0x0) {
            pcVar8->next = pcVar9;
            pcVar9->prev = pcVar8;
            item_00 = pcVar10;
          }
          input_buffer->offset = input_buffer->offset + 1;
          buffer_skip_whitespace(input_buffer);
          cVar5 = parse_string(pcVar9,input_buffer);
          if (cVar5 == 0) goto LAB_0012b320;
          buffer_skip_whitespace(input_buffer);
          pcVar9->string = pcVar9->valuestring;
          pcVar9->valuestring = (char *)0x0;
          uVar7 = input_buffer->offset;
          if ((input_buffer->length <= uVar7) || (input_buffer->content[uVar7] != ':'))
          goto LAB_0012b320;
          input_buffer->offset = uVar7 + 1;
          buffer_skip_whitespace(input_buffer);
          cVar5 = parse_value(pcVar9,input_buffer);
          if (cVar5 == 0) goto LAB_0012b320;
          buffer_skip_whitespace(input_buffer);
          uVar7 = input_buffer->offset;
          if (input_buffer->length <= uVar7) goto LAB_0012b320;
          pcVar10 = item_00;
          pcVar8 = pcVar9;
        } while (input_buffer->content[uVar7] == ',');
        if (input_buffer->content[uVar7] != '}') goto LAB_0012b320;
      }
      input_buffer->depth = input_buffer->depth - 1;
      item->type = 0x40;
      item->child = item_00;
      goto LAB_0012b172;
    }
  }
  else {
    if (uVar1 != '[') {
      return 0;
    }
    if (999 < input_buffer->depth) {
      return 0;
    }
    input_buffer->depth = input_buffer->depth + 1;
    if (*puVar12 != '[') {
      return 0;
    }
    input_buffer->offset = uVar3 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar7 = input_buffer->offset;
    if (uVar7 < input_buffer->length) {
      if (input_buffer->content[uVar7] == ']') {
        item_00 = (cJSON *)0x0;
      }
      else {
        input_buffer->offset = uVar7 - 1;
        item_00 = (cJSON *)0x0;
        pcVar10 = (cJSON *)0x0;
        do {
          pcVar8 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          if (pcVar8 == (cJSON *)0x0) goto joined_r0x0012b340;
          pcVar8->valuedouble = 0.0;
          pcVar8->string = (char *)0x0;
          pcVar8->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar8->valueint = 0;
          pcVar8->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar8->type = 0;
          pcVar8->next = (cJSON *)0x0;
          pcVar8->prev = (cJSON *)0x0;
          pcVar9 = pcVar8;
          if (item_00 != (cJSON *)0x0) {
            pcVar10->next = pcVar8;
            pcVar8->prev = pcVar10;
            pcVar9 = item_00;
          }
          item_00 = pcVar9;
          input_buffer->offset = input_buffer->offset + 1;
          buffer_skip_whitespace(input_buffer);
          cVar5 = parse_value(pcVar8,input_buffer);
          if (cVar5 == 0) goto LAB_0012b320;
          buffer_skip_whitespace(input_buffer);
          uVar7 = input_buffer->offset;
          if (input_buffer->length <= uVar7) goto LAB_0012b320;
          pcVar10 = pcVar8;
        } while (input_buffer->content[uVar7] == ',');
        if (input_buffer->content[uVar7] != ']') goto LAB_0012b320;
      }
      input_buffer->depth = input_buffer->depth - 1;
      item->type = 0x20;
      item->child = item_00;
LAB_0012b172:
      input_buffer->offset = uVar7 + 1;
      return 1;
    }
  }
  input_buffer->offset = uVar7 - 1;
  return 0;
joined_r0x0012b340:
  if (item_00 == (cJSON *)0x0) {
    return 0;
  }
LAB_0012b320:
  cJSON_Delete(item_00);
  return 0;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}